

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

int Fra_ClausBmcClauses(Clu_Man_t *p)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  sat_solver *s;
  int *piVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int local_4c;
  
  iVar6 = p->nPref;
  if ((iVar6 != 0) && (pVVar7 = p->vLits, 0 < pVVar7->nSize)) {
    iVar1 = p->pCnf->nVars;
    piVar3 = pVVar7->pArray;
    lVar10 = 0;
    do {
      piVar3[lVar10] = piVar3[lVar10] + iVar6 * iVar1 * 2;
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar7->nSize);
  }
  iVar1 = p->pCnf->nVars * 2;
  iVar6 = p->nFrames;
  if (iVar6 < 1) {
    local_4c = 0;
  }
  else {
    piVar3 = p->vLits->pArray;
    iVar9 = 0;
    local_4c = 0;
    do {
      pVVar7 = p->vClauses;
      if (0 < pVVar7->nSize) {
        lVar10 = 0;
        iVar6 = 0;
        do {
          if (p->vCosts->nSize <= lVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = pVVar7->pArray[lVar10];
          iVar5 = p->vCosts->pArray[lVar10];
          if (iVar5 != -1) {
            if (iVar5 < 1) {
              __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                            ,0x39f,"int Fra_ClausBmcClauses(Clu_Man_t *)");
            }
            if (p->nLutSize < iVar2 - iVar6) {
              __assert_fail("End - Beg <= p->nLutSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                            ,0x3a0,"int Fra_ClausBmcClauses(Clu_Man_t *)");
            }
            lVar11 = (long)iVar2;
            if (iVar6 < iVar2) {
              lVar8 = (long)iVar6;
              do {
                *(byte *)(piVar3 + lVar8) = *(byte *)(piVar3 + lVar8) ^ 1;
                lVar8 = lVar8 + 1;
              } while (lVar11 != lVar8);
            }
            lVar8 = (long)iVar6;
            iVar5 = sat_solver_solve(p->pSatBmc,piVar3 + lVar8,piVar3 + lVar11,(long)p->nBTLimit,0,0
                                     ,0);
            if (iVar6 < iVar2) {
              do {
                *(byte *)(piVar3 + lVar8) = *(byte *)(piVar3 + lVar8) ^ 1;
                lVar8 = lVar8 + 1;
              } while (lVar11 != lVar8);
            }
            if (iVar5 == -1) {
              s = p->pSatBmc;
              if (s->qtail != s->qhead) {
                iVar6 = sat_solver_simplify(s);
                if (iVar6 == 0) {
                  __assert_fail("RetValue != 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                                ,0x3bf,"int Fra_ClausBmcClauses(Clu_Man_t *)");
                }
                if (p->pSatBmc->qtail != p->pSatBmc->qhead) {
                  __assert_fail("p->pSatBmc->qtail == p->pSatBmc->qhead",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                                ,0x3c0,"int Fra_ClausBmcClauses(Clu_Man_t *)");
                }
              }
            }
            else {
              if (p->vCosts->nSize <= lVar10) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              p->vCosts->pArray[lVar10] = -1;
              local_4c = local_4c + 1;
            }
          }
          lVar10 = lVar10 + 1;
          pVVar7 = p->vClauses;
          iVar6 = iVar2;
        } while (lVar10 < pVVar7->nSize);
      }
      pVVar7 = p->vLits;
      if (0 < pVVar7->nSize) {
        piVar4 = pVVar7->pArray;
        lVar10 = 0;
        do {
          piVar4[lVar10] = piVar4[lVar10] + iVar1;
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar7->nSize);
      }
      iVar9 = iVar9 + 1;
      iVar6 = p->nFrames;
    } while (iVar9 < iVar6);
  }
  pVVar7 = p->vLits;
  if (0 < pVVar7->nSize) {
    iVar9 = p->nPref;
    piVar3 = pVVar7->pArray;
    lVar10 = 0;
    do {
      piVar3[lVar10] = piVar3[lVar10] - (iVar6 + iVar9) * iVar1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar7->nSize);
  }
  return local_4c;
}

Assistant:

int Fra_ClausBmcClauses( Clu_Man_t * p )
{
    int * pStart, nLitsTot, RetValue, Beg, End, Counter, i, k, f;
/*
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        printf( "%d ", p->vLits->pArray[i] );
    printf( "\n" );
*/
    // add the clauses
    Counter = 0;
    // skip through the prefix variables
    if ( p->nPref )
    {
        nLitsTot = p->nPref * 2 * p->pCnf->nVars;
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }
    // go through the timeframes
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLits);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            if ( Vec_IntEntry( p->vCosts, i ) == -1 )
            {
                Beg = End;
                continue;
            }
            assert( Vec_IntEntry( p->vCosts, i ) > 0 );
            assert( End - Beg <= p->nLutSize );

            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );
            RetValue = sat_solver_solve( p->pSatBmc, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );

            if ( RetValue != l_False )
            {
                Beg = End;
                Vec_IntWriteEntry( p->vCosts, i, -1 );
                Counter++;
                continue;
            }
/*
            // add the clause
            RetValue = sat_solver_addclause( p->pSatBmc, pStart + Beg, pStart + End );
    //        assert( RetValue == 1 );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding BMC clauses.\n" );
                return -1;
            }
*/
            Beg = End;

            // simplify the solver
            if ( p->pSatBmc->qtail != p->pSatBmc->qhead )
            {
                RetValue = sat_solver_simplify(p->pSatBmc);
                assert( RetValue != 0 );
                assert( p->pSatBmc->qtail == p->pSatBmc->qhead );
            }
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }

    // return clauses back to normal
    nLitsTot = (p->nPref + p->nFrames) * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        p->vLits->pArray[i] -= nLitsTot;
/*
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        printf( "%d ", p->vLits->pArray[i] );
    printf( "\n" );
*/
    return Counter;
}